

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O0

void cinemo::wh::printFlags(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Error flags are 8 bit (XXXXXXXX). If there is any error, program can not encode the file. A set bit on each position has the following meanings (BIT_0 = LSB):\n"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_0 I/O error on opening/reading WAV file.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\tBIT_1 WAV File is too small, it should be at least ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2c);
  poVar1 = std::operator<<(poVar1," Bytes (which would not have any audio data!)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\tBIT_2 File does not begin with ASCII characters \"RIFF\".");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\tBIT_3 File does not contain ASCII characters \"WAVE\".");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\tBIT_4 File does not contain ASCII characters \"fmt \" for format specifications."
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\tBIT_5 File does not contain ASCII characters \"data\" for audio.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_6 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_7 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Warning flags (might cause instability or corruption if any is set):\n")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\tBIT_0 Size mismatch between what is declared in the WAV header and the actual file\'s size."
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\tBIT_1 WAV File is not standard PCM and its encoding is not guaranteed to work (yet)."
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_2 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_3 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_4 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_5 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_6 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tBIT_7 [unused in current version]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printFlags() {
            cout << "-------------------------------------" << endl;
            cout << "Error flags are 8 bit (XXXXXXXX). If there is any error, "
                    "program can not encode the file. A set bit on each position has "
                    "the following meanings (BIT_0 = LSB):\n" << endl;
            cout << "\tBIT_0 I/O error on opening/reading WAV file." << endl;
            cout << "\tBIT_1 WAV File is too small, it should be at least "
                 << WaveMinLength
                 << " Bytes (which would not have any audio data!)"
                 << endl;
            cout
                    << "\tBIT_2 File does not begin with ASCII characters \"RIFF\"."
                    << endl;
            cout << "\tBIT_3 File does not contain ASCII characters \"WAVE\"."
                 << endl;
            cout
                    << "\tBIT_4 File does not contain ASCII characters \"fmt \" for format specifications."
                    << endl;
            cout
                    << "\tBIT_5 File does not contain ASCII characters \"data\" for audio."
                    << endl;
            cout << "\tBIT_6 [unused in current version]" << endl;
            cout << "\tBIT_7 [unused in current version]" << endl;
            cout << endl;
            cout
                    << "Warning flags (might cause instability or corruption if any "
                            "is set):\n" << endl;
            cout
                    << "\tBIT_0 Size mismatch between what is declared in the WAV header"
                            " and the actual file's size." << endl;
            cout << "\tBIT_1 WAV File is not standard PCM and its encoding "
                    "is not guaranteed to work (yet)." << endl;
            cout << "\tBIT_2 [unused in current version]" << endl;
            cout << "\tBIT_3 [unused in current version]" << endl;
            cout << "\tBIT_4 [unused in current version]" << endl;
            cout << "\tBIT_5 [unused in current version]" << endl;
            cout << "\tBIT_6 [unused in current version]" << endl;
            cout << "\tBIT_7 [unused in current version]" << endl;
            cout << "-------------------------------------" << endl;
        }